

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O2

void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk,int *pCounter)

{
  long *plVar1;
  Abc_Ntk_t *pNtk_00;
  undefined8 uVar2;
  uint __line;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  char Suffix [2000];
  
  memset(Suffix,0,2000);
  if (pNtk->ntkFunc == ABC_FUNC_BLACKBOX) {
    if (pNtk->vBoxes->nSize == 1) {
      pAVar4 = Abc_NtkBox(pNtk,0);
      Abc_NtkDupBox(pNtkNew,pAVar4,1);
      (((pAVar4->field_6).pCopy)->field_5).pData = pNtk;
      iVar9 = (((pAVar4->field_6).pCopy)->vFanins).nSize;
      if (iVar9 == pNtk->vPis->nSize) {
        for (lVar10 = 0; lVar10 < iVar9; lVar10 = lVar10 + 1) {
          pAVar5 = Abc_NtkPi(pNtk,(int)lVar10);
          Abc_ObjAddFanin((Abc_Obj_t *)
                          ((pAVar4->field_6).pCopy)->pNtk->vObjs->pArray
                          [(((pAVar4->field_6).pCopy)->vFanins).pArray[lVar10]],
                          *(Abc_Obj_t **)
                           ((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40));
          iVar9 = pNtk->vPis->nSize;
        }
        iVar9 = (((pAVar4->field_6).pCopy)->vFanouts).nSize;
        if (iVar9 == pNtk->vPos->nSize) {
          for (lVar10 = 0; lVar10 < iVar9; lVar10 = lVar10 + 1) {
            pAVar5 = Abc_NtkPo(pNtk,(int)lVar10);
            Abc_ObjAddFanin(*(Abc_Obj_t **)
                             ((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40),
                            (Abc_Obj_t *)
                            ((pAVar4->field_6).pCopy)->pNtk->vObjs->pArray
                            [(((pAVar4->field_6).pCopy)->vFanouts).pArray[lVar10]]);
            iVar9 = pNtk->vPos->nSize;
          }
          return;
        }
        pcVar8 = "Abc_ObjFanoutNum(pObj->pCopy) == Abc_NtkPoNum(pNtk)";
        __line = 0x44;
      }
      else {
        pcVar8 = "Abc_ObjFaninNum(pObj->pCopy) == Abc_NtkPiNum(pNtk)";
        __line = 0x3f;
      }
    }
    else {
      pcVar8 = "Abc_NtkBoxNum(pNtk) == 1";
      __line = 0x39;
    }
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                  ,__line,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
    ;
  }
  iVar9 = *pCounter;
  *pCounter = iVar9 + 1;
  if (iVar9 + 1 != 0) {
    sprintf(Suffix,"_%s_%d",pNtk->pName);
  }
  for (iVar9 = 0; iVar9 < pNtk->vBoxes->nSize; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkBox(pNtk,iVar9);
    for (lVar10 = 0; lVar10 < (pAVar4->vFanins).nSize; lVar10 = lVar10 + 1) {
      plVar1 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar10]];
      pAVar5 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      if ((pAVar5->field_6).pTemp == (void *)0x0) {
        pcVar8 = Abc_ObjNameSuffix(pAVar5,Suffix);
        pAVar6 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar8);
        (pAVar5->field_6).pCopy = pAVar6;
      }
    }
    for (lVar10 = 0; lVar10 < (pAVar4->vFanouts).nSize; lVar10 = lVar10 + 1) {
      plVar1 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar10]];
      pAVar5 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
      if ((pAVar5->field_6).pTemp == (void *)0x0) {
        pcVar8 = Abc_ObjNameSuffix(pAVar5,Suffix);
        pAVar6 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar8);
        (pAVar5->field_6).pCopy = pAVar6;
      }
    }
  }
  Abc_NtkIncrementTravId(pNtk);
  for (iVar9 = 0; iVar9 < pNtk->vPis->nSize; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkPi(pNtk,iVar9);
    Abc_NodeSetTravIdCurrent(pAVar4);
  }
  for (iVar9 = 0; iVar9 < pNtk->vPos->nSize; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkPo(pNtk,iVar9);
    Abc_NodeSetTravIdCurrent(pAVar4);
    pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
    pcVar8 = Abc_ObjName(pAVar4);
    iVar3 = strncmp(pcVar8,"abc_property",0xc);
    if (iVar3 == 0) {
      pAVar5 = Abc_NtkCreatePo(((pAVar4->field_6).pCopy)->pNtk);
      Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
      pcVar8 = Nm_ManFindNameById(((pAVar4->field_6).pCopy)->pNtk->pManName,
                                  ((pAVar4->field_6).pCopy)->Id);
      if (pcVar8 != (char *)0x0) {
        Nm_ManDeleteIdName(((pAVar4->field_6).pCopy)->pNtk->pManName,((pAVar4->field_6).pCopy)->Id);
      }
      pAVar5 = (pAVar4->field_6).pCopy;
      pcVar8 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,pcVar8,Suffix);
    }
  }
  for (iVar9 = 0; iVar9 < pNtk->vBoxes->nSize; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkBox(pNtk,iVar9);
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) != 8) {
      Abc_NodeSetTravIdCurrent(pAVar4);
      for (lVar10 = 0; lVar10 < (pAVar4->vFanins).nSize; lVar10 = lVar10 + 1) {
        Abc_NodeSetTravIdCurrent
                  ((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar10]]);
      }
      for (lVar10 = 0; lVar10 < (pAVar4->vFanouts).nSize; lVar10 = lVar10 + 1) {
        Abc_NodeSetTravIdCurrent
                  ((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar10]]);
      }
    }
  }
  for (iVar9 = 0; iVar3 = pNtk->vObjs->nSize, iVar9 < iVar3; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar9);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_NodeIsTravIdCurrent(pAVar4), iVar3 == 0)) &&
       ((pAVar4->field_6).pTemp == (void *)0x0)) {
      Abc_NtkDupObj(pNtkNew,pAVar4,0);
    }
  }
  for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar9);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_NodeIsTravIdCurrent(pAVar4), iVar3 == 0)) {
      for (lVar10 = 0; lVar10 < (pAVar4->vFanins).nSize; lVar10 = lVar10 + 1) {
        pAVar5 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar10]];
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar3 == 0) {
          Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar5->field_6).pCopy);
        }
      }
    }
    iVar3 = pNtk->vObjs->nSize;
  }
  iVar9 = 0;
  do {
    if (pNtk->vBoxes->nSize <= iVar9) {
      if ((pNtk->ntkFunc == ABC_FUNC_BLIFMV) && (pvVar7 = Abc_NtkMvVar(pNtk), pvVar7 != (void *)0x0)
         ) {
        pvVar7 = Abc_NtkMvVar(pNtkNew);
        if (pvVar7 == (void *)0x0) {
          Abc_NtkStartMvVars(pNtkNew);
        }
        for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
          pAVar4 = Abc_NtkObj(pNtk,iVar9);
          if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 6)) {
            pAVar5 = (pAVar4->field_6).pCopy;
            iVar3 = Abc_ObjMvVarNum(pAVar4);
            Abc_NtkSetMvVarValues(pAVar5,iVar3);
          }
        }
      }
      return;
    }
    pAVar4 = Abc_NtkBox(pNtk,iVar9);
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) != 8) {
      pNtk_00 = (Abc_Ntk_t *)(pAVar4->field_5).pData;
      if ((pAVar4->vFanins).nSize != pNtk_00->vPis->nSize) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                      ,0x97,
                      "void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
      }
      if ((pAVar4->vFanouts).nSize != pNtk_00->vPos->nSize) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                      ,0x98,
                      "void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
      }
      Abc_NtkCleanCopy(pNtk_00);
      for (lVar10 = 0; lVar10 < (pAVar4->vFanins).nSize; lVar10 = lVar10 + 1) {
        plVar1 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar10]];
        uVar2 = *(undefined8 *)
                 (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8)
                 + 0x40);
        pAVar5 = Abc_NtkPi(pNtk_00,(int)lVar10);
        *(undefined8 *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40) =
             uVar2;
      }
      for (lVar10 = 0; lVar10 < (pAVar4->vFanouts).nSize; lVar10 = lVar10 + 1) {
        plVar1 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar10]];
        uVar2 = *(undefined8 *)
                 (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8)
                 + 0x40);
        pAVar5 = Abc_NtkPo(pNtk_00,(int)lVar10);
        *(undefined8 *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40) = uVar2
        ;
      }
      Abc_NtkFlattenLogicHierarchy2_rec(pNtkNew,pNtk_00,pCounter);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Recursively flattens logic hierarchy of the netlist.]

  Description [When this procedure is called, the PI/PO nets of the old 
  netlist point to the corresponding nets of the flattened netlist.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkFlattenLogicHierarchy2_rec( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk, int * pCounter )
{
    char Suffix[2000] = {0};
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pTerm, * pNet, * pFanin;
    int i, k;

    // process the blackbox
    if ( Abc_NtkHasBlackbox(pNtk) )
    {
        // duplicate the blackbox
        assert( Abc_NtkBoxNum(pNtk) == 1 );
        pObj = Abc_NtkBox( pNtk, 0 );
        Abc_NtkDupBox( pNtkNew, pObj, 1 );
        pObj->pCopy->pData = pNtk;

        // connect blackbox fanins to the PI nets
        assert( Abc_ObjFaninNum(pObj->pCopy) == Abc_NtkPiNum(pNtk) );
        Abc_NtkForEachPi( pNtk, pTerm, i )
            Abc_ObjAddFanin( Abc_ObjFanin(pObj->pCopy,i), Abc_ObjFanout0(pTerm)->pCopy );

        // connect blackbox fanouts to the PO nets
        assert( Abc_ObjFanoutNum(pObj->pCopy) == Abc_NtkPoNum(pNtk) );
        Abc_NtkForEachPo( pNtk, pTerm, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pTerm)->pCopy, Abc_ObjFanout(pObj->pCopy,i) );
        return;
    }

    (*pCounter)++;

    // create the suffix, which will be appended to the internal names
    if ( *pCounter )
        sprintf( Suffix, "_%s_%d", Abc_NtkName(pNtk), *pCounter );

    // duplicate nets of all boxes, including latches
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pTerm, k )
        {
            pNet = Abc_ObjFanin0(pTerm);
            if ( pNet->pCopy )
                continue;
            pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjNameSuffix(pNet, Suffix) );
        }
        Abc_ObjForEachFanout( pObj, pTerm, k )
        {
            pNet = Abc_ObjFanout0(pTerm);
            if ( pNet->pCopy )
                continue;
            pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjNameSuffix(pNet, Suffix) );
        }
    }

    // mark objects that will not be used
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NodeSetTravIdCurrent( pTerm );
        // if the netlist has net names beginning with "abc_property_"
        // these names will be addes as primary outputs of the network
        pNet = Abc_ObjFanin0(pTerm);
        if ( strncmp( Abc_ObjName(pNet), "abc_property", 12 ) )
            continue;
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNet->pCopy->pNtk), pNet->pCopy );
        if ( Nm_ManFindNameById(pNet->pCopy->pNtk->pManName, pNet->pCopy->Id) )
            Nm_ManDeleteIdName(pNet->pCopy->pNtk->pManName, pNet->pCopy->Id);
        Abc_ObjAssignName( pNet->pCopy, Abc_ObjName(pNet), Suffix );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_NodeSetTravIdCurrent( pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_NodeSetTravIdCurrent( pTerm );
    }

    // duplicate objects that do not have prototypes yet
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( pObj->pCopy )
            continue;
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    }

    // connect objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // call recursively
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
        // clean the node copy fields
        Abc_NtkCleanCopy( pNtkModel );
        // map PIs/POs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->pCopy = Abc_ObjFanin0(pTerm)->pCopy;
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->pCopy = Abc_ObjFanout0(pTerm)->pCopy;
        // call recursively
        Abc_NtkFlattenLogicHierarchy2_rec( pNtkNew, pNtkModel, pCounter );
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }
}